

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

int glucose_solver_addclause(SimpSolver *S,int *plits,int nlits)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Lit local_48 [2];
  Lit p;
  int local_34;
  undefined1 local_30 [4];
  int i;
  vec<Gluco::Lit> lits;
  int *piStack_18;
  int nlits_local;
  int *plits_local;
  SimpSolver *S_local;
  
  lits.cap = nlits;
  Gluco::vec<Gluco::Lit>::vec((vec<Gluco::Lit> *)local_30);
  local_34 = 0;
  piStack_18 = plits;
  while( true ) {
    if (lits.cap <= local_34) {
      bVar2 = Gluco::SimpSolver::addClause(S,(vec<Gluco::Lit> *)local_30);
      Gluco::vec<Gluco::Lit>::~vec((vec<Gluco::Lit> *)local_30);
      return (uint)bVar2;
    }
    while (iVar1 = *piStack_18, iVar3 = Gluco::Solver::nVars(&S->super_Solver), iVar3 <= iVar1 / 2)
    {
      Gluco::SimpSolver::newVar(S,true,true);
    }
    iVar1 = *piStack_18;
    iVar3 = Gluco::Solver::nVars(&S->super_Solver);
    if (iVar3 <= iVar1 / 2) break;
    local_48[0].x = *piStack_18;
    Gluco::vec<Gluco::Lit>::push((vec<Gluco::Lit> *)local_30,local_48);
    local_34 = local_34 + 1;
    piStack_18 = piStack_18 + 1;
  }
  __assert_fail("(*plits)/2 < S->nVars()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                ,0x55,"int glucose_solver_addclause(Gluco::SimpSolver *, int *, int)");
}

Assistant:

int glucose_solver_addclause(Gluco::SimpSolver* S, int * plits, int nlits)
{
    vec<Lit> lits;
    for ( int i = 0; i < nlits; i++,plits++)
    {
        // note: Glucose uses the same var->lit conventiaon as ABC
        while ((*plits)/2 >= S->nVars()) S->newVar();
        assert((*plits)/2 < S->nVars()); // NOTE: since we explicitely use new function bmc_add_var
        Lit p;
        p.x = *plits;
        lits.push(p);
    }
    return S->addClause(lits); // returns 0 if the problem is UNSAT
}